

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VDotProdMultiAllReduce(N_Vector X,sunindextype local_length,int myid)

{
  int iVar1;
  uint in_EDX;
  long in_RSI;
  N_Vector in_RDI;
  sunrealtype dotprods [3];
  N_Vector *V;
  sunindextype global_length;
  double maxt;
  double stop_time;
  double start_time;
  int ierr;
  int failure;
  int fails;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 *local_50;
  long local_48;
  double local_40;
  double local_38;
  double local_30;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  long local_18;
  N_Vector local_10;
  int local_4;
  
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  if (in_RDI->ops->nvdotprodmultiallreduce == (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0)
  {
    local_4 = 0;
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_48 = N_VGetLength(in_RDI);
    local_50 = (undefined8 *)N_VCloneVectorArray(3,local_10);
    N_VConst(0x4000000000000000,local_10);
    N_VConst(0x3fe0000000000000,*local_50);
    local_30 = get_time();
    local_28 = N_VDotProdMultiLocal(1,local_10,local_50,&local_68);
    sync_device(local_10);
    local_38 = get_time();
    if (local_28 == 0) {
      local_24 = SUNRCompare(local_68,(double)local_18);
    }
    else {
      local_24 = 1;
    }
    if (local_24 == 0) {
      if (local_1c == 0) {
        printf("PASSED test -- N_VDotProdMultiAllReduce Case 1 \n");
      }
    }
    else {
      printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 1, Proc %d \n",(ulong)local_1c);
      local_20 = local_20 + 1;
    }
    local_40 = max_time(local_10,local_38 - local_30);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",local_40,"N_VDotProdMultiLocal");
    }
    local_30 = get_time();
    local_28 = N_VDotProdMultiAllReduce(1,local_10,&local_68);
    sync_device(local_10);
    local_38 = get_time();
    if (local_28 == 0) {
      local_24 = SUNRCompare(local_68,(double)local_48);
    }
    else {
      local_24 = 1;
    }
    if (local_24 == 0) {
      if (local_1c == 0) {
        printf("PASSED test -- N_VDotProdMultiAllReduce Case 1 \n");
      }
    }
    else {
      printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 1, Proc %d \n",(ulong)local_1c);
      local_20 = local_20 + 1;
    }
    local_40 = max_time(local_10,local_38 - local_30);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",local_40,"N_VDotProdMultiAllReduce");
    }
    N_VConst(0x4000000000000000,local_10);
    N_VConst(0xbfe0000000000000,*local_50);
    N_VConst(0x3fe0000000000000,local_50[1]);
    N_VConst(0x3ff0000000000000,local_50[2]);
    local_30 = get_time();
    local_28 = N_VDotProdMultiLocal(3,local_10,local_50,&local_68);
    sync_device(local_10);
    local_38 = get_time();
    if (local_28 == 0) {
      local_24 = SUNRCompare(local_68,(double)local_18 * -1.0);
      iVar1 = SUNRCompare(local_60,(double)local_18);
      local_24 = iVar1 + local_24;
      iVar1 = SUNRCompare(local_58,(double)local_18 * 2.0);
      local_24 = iVar1 + local_24;
    }
    else {
      local_24 = 1;
    }
    if (local_24 == 0) {
      if (local_1c == 0) {
        printf("PASSED test -- N_VDotProdMultiLocal Case 2 \n");
      }
    }
    else {
      printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n",(ulong)local_1c);
      local_20 = local_20 + 1;
    }
    local_40 = max_time(local_10,local_38 - local_30);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",local_40,"N_VDotProdMultiLocal");
    }
    local_30 = get_time();
    local_28 = N_VDotProdMultiAllReduce(3,local_10,&local_68);
    sync_device(local_10);
    local_38 = get_time();
    if (local_28 == 0) {
      local_24 = SUNRCompare(local_68,(double)local_48 * -1.0);
      iVar1 = SUNRCompare(local_60,(double)local_48);
      local_24 = iVar1 + local_24;
      iVar1 = SUNRCompare(local_58,(double)local_48 * 2.0);
      local_24 = iVar1 + local_24;
    }
    else {
      local_24 = 1;
    }
    if (local_24 == 0) {
      if (local_1c == 0) {
        printf("PASSED test -- N_VDotProdMultiAllReduce Case 2 \n");
      }
    }
    else {
      printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 2, Proc %d \n",(ulong)local_1c);
      local_20 = local_20 + 1;
    }
    local_40 = max_time(local_10,local_38 - local_30);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",local_40,"N_VDotProdMultiAllReduce");
    }
    N_VDestroyVectorArray(local_50,3);
    local_4 = local_20;
  }
  return local_4;
}

Assistant:

int Test_N_VDotProdMultiAllReduce(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunindextype global_length;
  N_Vector* V;
  sunrealtype dotprods[3];

  /* only test if the operation is implemented, local vectors (non-MPI) do not
     provide this function */
  if (!(X->ops->nvdotprodmultiallreduce)) { return 0; }

  /* get global length */
  global_length = N_VGetLength(X);

  /* create vectors for testing */
  V = N_VCloneVectorArray(3, X);

  /*
   * Case 1: d[0] = z . V[0], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(HALF, V[0]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(1, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[0] should equal the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 1, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiAllReduce Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /* perform the global reduction */
  start_time = get_time();
  ierr       = N_VDotProdMultiAllReduce(1, X, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[0] should equal the global vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)global_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 1, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiAllReduce Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiAllReduce", maxt);

  /*
   * Case 2: d[i] = z . V[i], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(NEG_HALF, V[0]);
  N_VConst(HALF, V[1]);
  N_VConst(ONE, V[2]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(3, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[i] should equal -1, +1, and 2 times the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)-1 * local_length);
    failure += SUNRCompare(dotprods[1], (sunrealtype)local_length);
    failure += SUNRCompare(dotprods[2], (sunrealtype)2 * local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiLocal Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /* perform the global reduction */
  start_time = get_time();
  ierr       = N_VDotProdMultiAllReduce(3, X, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[i] should equal -1, +1, and 2 times the global vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)-1 * global_length);
    failure += SUNRCompare(dotprods[1], (sunrealtype)global_length);
    failure += SUNRCompare(dotprods[2], (sunrealtype)2 * global_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 2, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiAllReduce Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiAllReduce", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(V, 3);

  return (fails);
}